

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall
HEkk::computeInfeasibilitiesForReporting(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase)

{
  computeSimplexPrimalInfeasible(this);
  if ((algorithm != kPrimal) && (solve_phase == 1)) {
    computeSimplexLpDualInfeasible(this);
    return;
  }
  computeSimplexDualInfeasible(this);
  return;
}

Assistant:

void HEkk::computeInfeasibilitiesForReporting(const SimplexAlgorithm algorithm,
                                              const HighsInt solve_phase) {
  if (algorithm == SimplexAlgorithm::kPrimal) {
    // Report the primal and dual infeasibilities
    computeSimplexInfeasible();
  } else {
    // Report the primal infeasibilities
    computeSimplexPrimalInfeasible();
    if (solve_phase == kSolvePhase1) {
      // In phase 1, report the simplex LP dual infeasibilities
      computeSimplexLpDualInfeasible();
    } else {
      // In phase 2, report the simplex dual infeasibilities
      computeSimplexDualInfeasible();
    }
  }
}